

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureSpecificationTests.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::TexCubeShader::shadeFragments
          (TexCubeShader *this,FragmentPacket *packets,int numPackets,
          FragmentShadingContext *context)

{
  uint uVar1;
  int iVar2;
  GenericVec4 *pGVar3;
  int iVar4;
  int fragNdx;
  long lVar5;
  int iVar6;
  float *pfVar7;
  ulong uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  Vec4 coord;
  Vec4 colors [4];
  Vec3 texCoords [4];
  float local_b8;
  float local_b4;
  Vec4 local_a8;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined1 local_68 [16];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68._0_4_ = 0.0;
  local_68._4_4_ = 0.0;
  local_68._8_8_ = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_a8.m_data[0] = 0.0;
  local_a8.m_data[1] = 0.0;
  local_a8.m_data[2] = 0.0;
  local_a8.m_data[3] = 0.0;
  if (0 < numPackets) {
    iVar6 = 0;
    uVar8 = 0;
    do {
      pfVar7 = (float *)(local_68 + 8);
      lVar5 = 0;
      do {
        rr::readTriangleVarying<float>((rr *)&local_b8,packets + uVar8,context,0,(int)lVar5);
        uVar1 = *(uint *)&(this->super_ShaderProgram).field_0x154;
        if (5 < uVar1) goto LAB_00f5efb4;
        fVar12 = -1.0;
        fVar9 = local_b8 + local_b8 + -1.0;
        fVar11 = local_b4 + local_b4 + -1.0;
        switch(uVar1) {
        case 0:
          fVar10 = -1.0;
          goto LAB_00f5ef86;
        case 1:
          fVar9 = -fVar9;
          fVar10 = 1.0;
          goto LAB_00f5ef86;
        case 2:
          fVar11 = -fVar11;
          break;
        case 3:
          fVar12 = 1.0;
          break;
        case 4:
          fVar10 = -fVar9;
          fVar9 = -1.0;
LAB_00f5ef86:
          fVar12 = -fVar11;
          fVar11 = fVar9;
          fVar9 = fVar10;
          break;
        case 5:
          fVar12 = -fVar11;
          fVar11 = 1.0;
        }
        pfVar7[-2] = fVar9;
        pfVar7[-1] = fVar12;
        *pfVar7 = fVar11;
LAB_00f5efb4:
        lVar5 = lVar5 + 1;
        pfVar7 = pfVar7 + 3;
      } while (lVar5 != 4);
      sglr::rc::TextureCube::sample4
                ((((this->super_ShaderProgram).m_uniforms.
                   super__Vector_base<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>._M_impl
                   .super__Vector_impl_data._M_start)->sampler).texCube,&local_a8,(Vec3 *)local_68,
                 0.0);
      pGVar3 = context->outputArray;
      iVar2 = context->numFragmentOutputs;
      iVar4 = iVar2 * iVar6;
      lVar5 = 0;
      do {
        pGVar3[iVar4].v.uData[0] = *(deUint32 *)((long)local_a8.m_data + lVar5);
        pGVar3[iVar4].v.uData[1] = *(deUint32 *)((long)local_a8.m_data + lVar5 + 4);
        pGVar3[iVar4].v.uData[2] = *(deUint32 *)((long)local_a8.m_data + lVar5 + 8);
        pGVar3[iVar4].v.uData[3] = *(deUint32 *)((long)local_a8.m_data + lVar5 + 0xc);
        lVar5 = lVar5 + 0x10;
        iVar4 = iVar4 + iVar2;
      } while (lVar5 != 0x40);
      uVar8 = uVar8 + 1;
      iVar6 = iVar6 + 4;
    } while (uVar8 != (uint)numPackets);
  }
  return;
}

Assistant:

void shadeFragments (rr::FragmentPacket* packets, const int numPackets, const rr::FragmentShadingContext& context) const
	{
		tcu::Vec3 texCoords[4];
		tcu::Vec4 colors[4];

		for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
		{
			// setup tex coords
			for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
			{
				const tcu::Vec4	coord	= rr::readTriangleVarying<float>(packets[packetNdx], context, 0, fragNdx);
				const float		x		= coord.x()*2.0f - 1.0f;
				const float		y		= coord.y()*2.0f - 1.0f;

				// Swizzle tex coords
				switch (m_face)
				{
					case tcu::CUBEFACE_NEGATIVE_X:	texCoords[fragNdx] = tcu::Vec3(-1.0f,    -y,    +x);		break;
					case tcu::CUBEFACE_POSITIVE_X:	texCoords[fragNdx] = tcu::Vec3(+1.0f,    -y,    -x);		break;
					case tcu::CUBEFACE_NEGATIVE_Y:	texCoords[fragNdx] = tcu::Vec3(   +x, -1.0f,    -y);		break;
					case tcu::CUBEFACE_POSITIVE_Y:	texCoords[fragNdx] = tcu::Vec3(   +x, +1.0f,    +y);		break;
					case tcu::CUBEFACE_NEGATIVE_Z:	texCoords[fragNdx] = tcu::Vec3(   -x,    -y, -1.0f);		break;
					case tcu::CUBEFACE_POSITIVE_Z:	texCoords[fragNdx] = tcu::Vec3(   +x,    -y, +1.0f);		break;
					default:
						DE_ASSERT(false);
				}
			}

			// Sample
			m_uniforms[0].sampler.texCube->sample4(colors, texCoords);

			// Write out
			for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
				rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, colors[fragNdx]);
		}
	}